

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_2::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
::json_value::json_value(json_value *this,value_t t)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *pmVar1;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *pbVar4;
  other_error *__return_storage_ptr__;
  allocator<char> local_39;
  string local_38;
  value_t local_11;
  json_value *pjStack_10;
  value_t t_local;
  json_value *this_local;
  
  local_11 = t;
  pjStack_10 = this;
  switch(t) {
  case null:
    *(undefined8 *)this = 0;
    break;
  case object:
    pmVar1 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::
             create<std::map<std::__cxx11::string,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                       ();
    *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      **)this = pmVar1;
    break;
  case array:
    pvVar2 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::
             create<std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                       ();
    *(vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      **)this = pvVar2;
    break;
  case string:
    pbVar3 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::create<std::__cxx11::string,char_const(&)[1]>((char (*) [1])0x2ce85e);
    *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this = pbVar3;
    break;
  case boolean:
    *this = (json_value)0x0;
    break;
  case number_integer:
    *(undefined8 *)this = 0;
    break;
  case number_unsigned:
    *(undefined8 *)this = 0;
    break;
  case number_float:
    *(undefined8 *)this = 0;
    break;
  case binary:
    pbVar4 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::
             create<nlohmann::json_abi_v3_11_2::byte_container_with_subtype<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       ();
    *(byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> **)
     this = pbVar4;
    break;
  case discarded:
  default:
    *(undefined8 *)this = 0;
    if (t == null) {
      __return_storage_ptr__ = (other_error *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"961c151d2e87f2686a955a9be24d316f1362bf21 3.11.2",&local_39);
      detail::other_error::create<std::nullptr_t,_0>
                (__return_storage_ptr__,500,&local_38,(void *)0x0);
      __cxa_throw(__return_storage_ptr__,&detail::other_error::typeinfo,
                  detail::other_error::~other_error);
    }
  }
  return;
}

Assistant:

json_value(value_t t)
        {
            switch (t)
            {
                case value_t::object:
                {
                    object = create<object_t>();
                    break;
                }

                case value_t::array:
                {
                    array = create<array_t>();
                    break;
                }

                case value_t::string:
                {
                    string = create<string_t>("");
                    break;
                }

                case value_t::binary:
                {
                    binary = create<binary_t>();
                    break;
                }

                case value_t::boolean:
                {
                    boolean = static_cast<boolean_t>(false);
                    break;
                }

                case value_t::number_integer:
                {
                    number_integer = static_cast<number_integer_t>(0);
                    break;
                }

                case value_t::number_unsigned:
                {
                    number_unsigned = static_cast<number_unsigned_t>(0);
                    break;
                }

                case value_t::number_float:
                {
                    number_float = static_cast<number_float_t>(0.0);
                    break;
                }

                case value_t::null:
                {
                    object = nullptr;  // silence warning, see #821
                    break;
                }

                case value_t::discarded:
                default:
                {
                    object = nullptr;  // silence warning, see #821
                    if (JSON_HEDLEY_UNLIKELY(t == value_t::null))
                    {
                        JSON_THROW(other_error::create(500, "961c151d2e87f2686a955a9be24d316f1362bf21 3.11.2", nullptr)); // LCOV_EXCL_LINE
                    }
                    break;
                }
            }
        }